

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleZomby.cpp
# Opt level: O0

void __thiscall SimpleZomby::Zomby::~Zomby(Zomby *this)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  element_type *peVar4;
  string local_1c8 [32];
  undefined1 local_1a8 [16];
  shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  ostringstream local_188 [8];
  ostringstream buf;
  Zomby *this_local;
  
  std::atomic<bool>::operator=(&this->_semaphore,false);
  bVar1 = std::thread::joinable(&this->_thread);
  if (bVar1) {
    std::thread::detach();
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_listener);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    if (this == (Zomby *)0x0) {
      __cxa_bad_typeid();
    }
    pcVar2 = std::type_info::name((type_info *)(this->super_Manager)._vptr_Manager[-1]);
    poVar3 = std::operator<<((ostream *)local_188,pcVar2);
    poVar3 = std::operator<<(poVar3,"::");
    poVar3 = std::operator<<(poVar3,"~Zomby");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    peVar4 = std::__shared_ptr_access<Common::Listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Common::Listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_listener);
    std::__cxx11::ostringstream::str();
    std::make_shared<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    std::shared_ptr<std::__cxx11::string_const>::shared_ptr<std::__cxx11::string,void>
              ((shared_ptr<std::__cxx11::string_const> *)&local_198,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1a8);
    (*peVar4->_vptr_Listener[2])(peVar4,(shared_ptr<std::__cxx11::string_const> *)&local_198);
    std::
    shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~shared_ptr(&local_198);
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1a8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  std::thread::~thread(&this->_thread);
  std::shared_ptr<Common::Listener>::~shared_ptr(&this->_listener);
  std::enable_shared_from_this<SimpleZomby::Zomby>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<SimpleZomby::Zomby>);
  Common::Manager::~Manager(&this->super_Manager);
  return;
}

Assistant:

Zomby::~Zomby()
{
    _semaphore = false;

    if (_thread.joinable()) {
        _thread.detach();
    }

    if (_listener) {
        std::ostringstream buf;
        buf << typeid(*this).name() << "::" << __func__ << std::endl;
        _listener->processData(std::make_shared<Common::Listener::Data>(buf.str()));
    }
}